

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void sexp_make_unblocking(sexp_conflict ctx,sexp_conflict port)

{
  int iVar1;
  int *in_RSI;
  int local_40;
  int local_38;
  int local_30;
  int local_28;
  long local_20;
  long local_18;
  
  if (((((ulong)in_RSI & 3) == 0) && (*in_RSI == 0x10)) ||
     ((((ulong)in_RSI & 3) == 0 && (*in_RSI == 0x11)))) {
    if (*(long *)(in_RSI + 8) == 0) {
      if (((*(ulong *)(in_RSI + 6) & 3) == 0) && (**(int **)(in_RSI + 6) == 0x12)) {
        local_20 = *(long *)(*(long *)(in_RSI + 6) + 0x10);
      }
      else {
        local_20 = -1;
      }
      local_18 = local_20;
    }
    else {
      iVar1 = fileno(*(FILE **)(in_RSI + 8));
      local_18 = (long)iVar1;
    }
    if (-1 < local_18) {
      if (*(long *)(in_RSI + 0x12) == -1) {
        if (*(long *)(in_RSI + 8) == 0) {
          if (((*(ulong *)(in_RSI + 6) & 3) == 0) && (**(int **)(in_RSI + 6) == 0x12)) {
            local_30 = (int)*(undefined8 *)(*(long *)(in_RSI + 6) + 0x10);
          }
          else {
            local_30 = -1;
          }
          local_28 = local_30;
        }
        else {
          local_28 = fileno(*(FILE **)(in_RSI + 8));
        }
        iVar1 = fcntl(local_28,3);
        *(long *)(in_RSI + 0x12) = (long)iVar1;
      }
      if ((*(ulong *)(in_RSI + 0x12) & 0x800) == 0) {
        if (*(long *)(in_RSI + 8) == 0) {
          if (((*(ulong *)(in_RSI + 6) & 3) == 0) && (**(int **)(in_RSI + 6) == 0x12)) {
            local_40 = (int)*(undefined8 *)(*(long *)(in_RSI + 6) + 0x10);
          }
          else {
            local_40 = -1;
          }
          local_38 = local_40;
        }
        else {
          local_38 = fileno(*(FILE **)(in_RSI + 8));
        }
        iVar1 = fcntl(local_38,4,*(ulong *)(in_RSI + 0x12) | 0x800);
        if (iVar1 == 0) {
          *(ulong *)(in_RSI + 0x12) = *(ulong *)(in_RSI + 0x12) | 0x800;
        }
      }
    }
  }
  return;
}

Assistant:

static void sexp_make_unblocking (sexp ctx, sexp port) {
  if (!(sexp_portp(port) && sexp_port_fileno(port) >= 0))
    return;
  if (sexp_port_flags(port) == SEXP_PORT_UNKNOWN_FLAGS)
    sexp_port_flags(port) = fcntl(sexp_port_fileno(port), F_GETFL);
  if (!(sexp_port_flags(port) & O_NONBLOCK))
    if (fcntl(sexp_port_fileno(port), F_SETFL, sexp_port_flags(port) | O_NONBLOCK) == 0)
      sexp_port_flags(port) |= O_NONBLOCK;
}